

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O3

uint __thiscall
srell::
match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<srell::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
::lookup_backref_number
          (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<srell::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *this,char_type *begin,char_type *end)

{
  char_type *pcVar1;
  uint uVar2;
  long lVar3;
  undefined1 local_38 [8];
  gname_string key;
  
  regex_internal::simple_array<char>::simple_array
            ((simple_array<char> *)local_38,(long)end - (long)begin);
  if (end != begin) {
    lVar3 = 0;
    do {
      pcVar1 = begin + lVar3;
      *(char_type *)((long)local_38 + lVar3) = *pcVar1;
      lVar3 = lVar3 + 1;
    } while (pcVar1 + 1 != end);
  }
  uVar2 = regex_internal::groupname_and_backrefnumber_mapper<char,_unsigned_int>::operator[]
                    (&(this->gnames_).super_groupname_and_backrefnumber_mapper<char,_unsigned_int>,
                     (gname_string *)local_38);
  if (local_38 != (undefined1  [8])0x0) {
    free((void *)local_38);
  }
  return uVar2;
}

Assistant:

unsigned int lookup_backref_number(const char_type *begin, const char_type *const end) const
	{
		typename regex_internal::groupname_mapper<char_type>::gname_string key(end - begin);

		for (std::size_t i = 0; begin != end; ++begin, ++i)
			key[i] = *begin;

		return gnames_[key];
	}